

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise.cpp
# Opt level: O2

int __thiscall
ncnn::ConvolutionDepthWise::forward_int8
          (ConvolutionDepthWise *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  undefined4 uVar1;
  float fVar2;
  float fVar3;
  int iVar4;
  int iVar5;
  size_t sVar6;
  void *pvVar7;
  float *pfVar8;
  undefined1 uVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  int iVar17;
  ulong uVar18;
  int j;
  int iVar19;
  long lVar20;
  size_type __n;
  int iVar21;
  int iVar22;
  long lVar23;
  long lVar24;
  int q;
  int iVar25;
  float *pfVar26;
  bool bVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  long lStack_200;
  long local_1d8;
  int local_1c8;
  float *local_1b8;
  Mat bottom_blob_bordered;
  Option opt_q;
  vector<int,_std::allocator<int>_> _space_ofs;
  Mat bottom_blob_int8;
  
  iVar13 = bottom_blob->c;
  local_1c8 = -100;
  if ((iVar13 % this->group == 0) && (this->num_output % this->group == 0)) {
    sVar6 = bottom_blob->elemsize;
    iVar4 = this->kernel_w;
    iVar19 = this->dilation_w;
    iVar5 = this->kernel_h;
    iVar11 = this->dilation_h;
    Mat::Mat(&bottom_blob_int8,bottom_blob);
    if (sVar6 != 1) {
      iVar10 = this->group;
      uVar18 = 0;
      Mat::Mat(&bottom_blob_bordered,iVar13,4,(Allocator *)0x0);
      iVar10 = iVar13 / iVar10;
      if (iVar10 < 1) {
        iVar10 = 0;
      }
      pvVar7 = (this->bottom_blob_int8_scales).data;
      uVar16 = (ulong)(uint)this->group;
      if (this->group < 1) {
        uVar16 = uVar18;
      }
      for (; uVar18 != uVar16; uVar18 = uVar18 + 1) {
        uVar1 = *(undefined4 *)((long)pvVar7 + uVar18 * 4);
        iVar21 = iVar10;
        while (bVar27 = iVar21 != 0, iVar21 = iVar21 + -1, bVar27) {
          *(undefined4 *)bottom_blob_bordered.data = uVar1;
          bottom_blob_bordered.data = (void *)((long)bottom_blob_bordered.data + 4);
        }
      }
      opt_q.lightmode = opt->lightmode;
      opt_q._1_3_ = *(undefined3 *)&opt->field_0x1;
      opt_q.num_threads = opt->num_threads;
      opt_q.workspace_allocator = opt->workspace_allocator;
      opt_q.openmp_blocktime = opt->openmp_blocktime;
      opt_q.use_winograd_convolution = opt->use_winograd_convolution;
      opt_q.use_sgemm_convolution = opt->use_sgemm_convolution;
      opt_q.use_int8_inference = opt->use_int8_inference;
      opt_q.use_vulkan_compute = opt->use_vulkan_compute;
      opt_q.use_bf16_storage = opt->use_bf16_storage;
      opt_q.use_fp16_packed = opt->use_fp16_packed;
      opt_q.use_fp16_storage = opt->use_fp16_storage;
      opt_q.use_fp16_arithmetic = opt->use_fp16_arithmetic;
      opt_q.use_int8_packed = opt->use_int8_packed;
      opt_q.use_int8_storage = opt->use_int8_storage;
      opt_q.use_int8_arithmetic = opt->use_int8_arithmetic;
      opt_q.use_packing_layout = opt->use_packing_layout;
      opt_q.use_shader_pack8 = opt->use_shader_pack8;
      opt_q.use_subgroup_basic = opt->use_subgroup_basic;
      opt_q.use_subgroup_vote = opt->use_subgroup_vote;
      opt_q.use_subgroup_ballot = opt->use_subgroup_ballot;
      opt_q.use_subgroup_shuffle = opt->use_subgroup_shuffle;
      opt_q.use_image_storage = opt->use_image_storage;
      opt_q.use_tensor_storage = opt->use_tensor_storage;
      opt_q.use_weight_fp16_storage = opt->use_weight_fp16_storage;
      opt_q.flush_denormals = opt->flush_denormals;
      opt_q.use_local_pool_allocator = opt->use_local_pool_allocator;
      opt_q.use_reserved_1 = opt->use_reserved_1;
      opt_q.use_reserved_2 = opt->use_reserved_2;
      opt_q.use_reserved_3 = opt->use_reserved_3;
      opt_q.use_reserved_4 = opt->use_reserved_4;
      opt_q.use_reserved_5 = opt->use_reserved_5;
      opt_q.use_reserved_6 = opt->use_reserved_6;
      opt_q.use_reserved_7 = opt->use_reserved_7;
      opt_q.use_reserved_8 = opt->use_reserved_8;
      opt_q.use_reserved_9 = opt->use_reserved_9;
      opt_q.use_reserved_10 = opt->use_reserved_10;
      opt_q.use_reserved_11 = opt->use_reserved_11;
      opt_q.blob_allocator = opt->workspace_allocator;
      quantize_to_int8(bottom_blob,&bottom_blob_int8,&bottom_blob_bordered,&opt_q);
      Mat::~Mat(&bottom_blob_bordered);
    }
    bottom_blob_bordered.cstep = 0;
    bottom_blob_bordered.data = (void *)0x0;
    bottom_blob_bordered.refcount._0_4_ = 0;
    bottom_blob_bordered.refcount._4_4_ = 0;
    bottom_blob_bordered.elemsize._0_4_ = 0;
    bottom_blob_bordered._20_8_ = 0;
    bottom_blob_bordered.allocator = (Allocator *)0x0;
    bottom_blob_bordered.dims = 0;
    bottom_blob_bordered.w = 0;
    bottom_blob_bordered.h = 0;
    bottom_blob_bordered.d = 0;
    bottom_blob_bordered.c = 0;
    make_padding(this,&bottom_blob_int8,&bottom_blob_bordered,opt);
    iVar10 = bottom_blob_bordered.w;
    local_1c8 = -100;
    if ((bottom_blob_bordered.data != (void *)0x0) &&
       ((long)bottom_blob_bordered.c * bottom_blob_bordered.cstep != 0)) {
      iVar21 = (~((iVar4 + -1) * iVar19) + bottom_blob_bordered.w) / this->stride_w;
      iVar5 = (~((iVar5 + -1) * iVar11) + bottom_blob_bordered.h) / this->stride_h;
      __n = (long)this->kernel_h * (long)this->kernel_w;
      std::vector<int,_std::allocator<int>_>::vector(&_space_ofs,__n,(allocator_type *)&opt_q);
      iVar4 = this->dilation_h;
      iVar19 = this->kernel_w;
      iVar11 = this->dilation_w * iVar19;
      iVar22 = 0;
      lVar23 = 0;
      for (iVar12 = 0; iVar12 < this->kernel_h; iVar12 = iVar12 + 1) {
        for (lVar24 = 0; (int)lVar24 < iVar19; lVar24 = lVar24 + 1) {
          _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[(int)lVar23 + lVar24] = iVar22;
          iVar22 = iVar22 + this->dilation_w;
          iVar19 = this->kernel_w;
        }
        iVar22 = iVar22 + (iVar10 * iVar4 - iVar11);
        lVar23 = (int)lVar23 + lVar24;
      }
      iVar4 = this->int8_scale_term;
      Mat::create(top_blob,iVar21 + 1,iVar5 + 1,this->num_output,(ulong)(iVar4 < 0x65) * 3 + 1,
                  opt->blob_allocator);
      local_1c8 = -100;
      if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
        iVar19 = this->group;
        iVar11 = (int)__n;
        if (iVar19 == this->num_output && iVar13 == iVar19) {
          local_1c8 = 0;
          uVar18 = 0;
          if (0 < iVar11) {
            uVar18 = __n & 0xffffffff;
          }
          local_1d8 = 0;
          for (lVar23 = 0; lVar23 < iVar13; lVar23 = lVar23 + 1) {
            Mat::channel((Mat *)&opt_q,top_blob,(int)lVar23);
            pfVar26 = (float *)opt_q._0_8_;
            Mat::~Mat((Mat *)&opt_q);
            pvVar7 = (this->weight_data).data;
            Mat::channel((Mat *)&opt_q,&bottom_blob_bordered,(int)lVar23);
            for (iVar13 = 0; iVar13 <= iVar5; iVar13 = iVar13 + 1) {
              for (iVar19 = 0; iVar19 <= iVar21; iVar19 = iVar19 + 1) {
                iVar11 = 0;
                for (uVar16 = 0; uVar18 != uVar16; uVar16 = uVar16 + 1) {
                  iVar11 = iVar11 + (int)*(char *)((long)pvVar7 + uVar16 + local_1d8) *
                                    (int)*(char *)((long)iVar19 * (long)this->stride_w +
                                                   (long)(int)opt_q._44_4_ *
                                                   (long)this->stride_h * (long)iVar13 *
                                                   (long)opt_q.workspace_allocator + opt_q._0_8_ +
                                                  (long)_space_ofs.
                                                                                                                
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start[uVar16]);
                }
                fVar29 = *(float *)((long)(this->weight_data_int8_scales).data + lVar23 * 4);
                fVar28 = 0.0;
                if (fVar29 != 0.0) {
                  fVar28 = 1.0 / (fVar29 * *(float *)((long)(this->bottom_blob_int8_scales).data +
                                                     lVar23 * 4));
                }
                fVar28 = (float)iVar11 * fVar28;
                if (this->bias_term != 0) {
                  fVar28 = fVar28 + *(float *)((long)(this->bias_data).data + lVar23 * 4);
                }
                fVar29 = fVar28;
                switch(this->activation_type) {
                case 1:
                  if (fVar28 <= 0.0) {
                    fVar29 = 0.0;
                  }
                  break;
                case 2:
                  fVar29 = (float)(~-(uint)(0.0 < fVar28) & *(this->activation_params).data |
                                  -(uint)(0.0 < fVar28) & 0x3f800000) * fVar28;
                  break;
                case 3:
                  pfVar8 = (float *)(this->activation_params).data;
                  fVar29 = *pfVar8;
                  if (fVar28 <= fVar29) {
                    fVar28 = fVar29;
                  }
                  fVar2 = pfVar8[1];
                  fVar29 = fVar28;
                  if (fVar2 <= fVar28) {
                    fVar29 = fVar2;
                  }
                  break;
                case 4:
                  fVar29 = expf(-fVar28);
                  fVar29 = 1.0 / (fVar29 + 1.0);
                  break;
                case 5:
                  fVar29 = expf(fVar28);
                  fVar29 = logf(fVar29 + 1.0);
                  fVar29 = tanhf(fVar29);
                  fVar29 = fVar29 * fVar28;
                  break;
                case 6:
                  pfVar8 = (float *)(this->activation_params).data;
                  fVar2 = *pfVar8;
                  fVar3 = pfVar8[1];
                  fVar30 = -fVar3 / fVar2;
                  fVar29 = 0.0;
                  if ((fVar30 <= fVar28) && (fVar29 = fVar28, fVar28 <= fVar30 + 1.0 / fVar2)) {
                    fVar29 = (fVar2 * fVar28 + fVar3) * fVar28;
                  }
                }
                if (iVar4 < 0x65) {
                  *pfVar26 = fVar29;
                  lStack_200 = 4;
                }
                else {
                  fVar29 = roundf(fVar29 * *(float *)((long)(this->top_blob_int8_scales).data +
                                                     lVar23 * 4));
                  iVar11 = (int)fVar29;
                  if (iVar11 < -0x7e) {
                    iVar11 = -0x7f;
                  }
                  uVar9 = (undefined1)iVar11;
                  if (0x7e < iVar11) {
                    uVar9 = 0x7f;
                  }
                  *(undefined1 *)pfVar26 = uVar9;
                  lStack_200 = 1;
                }
                pfVar26 = (float *)((long)pfVar26 + lStack_200);
              }
            }
            Mat::~Mat((Mat *)&opt_q);
            iVar13 = this->group;
            local_1d8 = local_1d8 + __n;
          }
        }
        else {
          iVar13 = iVar13 / iVar19;
          uVar18 = (long)this->num_output / (long)iVar19;
          iVar10 = (int)uVar18;
          local_1c8 = 0;
          uVar16 = 0;
          if (0 < iVar11) {
            uVar16 = __n & 0xffffffff;
          }
          iVar12 = 0;
          if (0 < iVar13) {
            iVar12 = iVar13;
          }
          uVar14 = 0;
          if (0 < iVar10) {
            uVar14 = uVar18 & 0xffffffff;
          }
          for (lVar23 = 0; lVar23 < iVar19; lVar23 = lVar23 + 1) {
            for (uVar18 = 0; uVar18 != uVar14; uVar18 = uVar18 + 1) {
              lVar24 = lVar23 * iVar10 + uVar18;
              Mat::channel((Mat *)&opt_q,top_blob,(int)lVar24);
              local_1b8 = (float *)opt_q._0_8_;
              Mat::~Mat((Mat *)&opt_q);
              pvVar7 = (this->weight_data).data;
              for (iVar19 = 0; iVar19 <= iVar5; iVar19 = iVar19 + 1) {
                for (iVar22 = 0; iVar22 <= iVar21; iVar22 = iVar22 + 1) {
                  iVar17 = 0;
                  lVar20 = (long)pvVar7 +
                           uVar18 * (long)(iVar13 * iVar11) +
                           (long)(iVar10 * iVar13 * iVar11 * (int)lVar23);
                  for (iVar25 = 0; iVar25 != iVar12; iVar25 = iVar25 + 1) {
                    Mat::channel((Mat *)&opt_q,&bottom_blob_bordered,iVar25 + iVar13 * (int)lVar23);
                    for (uVar15 = 0; uVar16 != uVar15; uVar15 = uVar15 + 1) {
                      iVar17 = iVar17 + (int)*(char *)(lVar20 + uVar15) *
                                        (int)*(char *)((long)iVar22 * (long)this->stride_w +
                                                       (long)(int)opt_q._44_4_ *
                                                       (long)iVar19 * (long)this->stride_h *
                                                       (long)opt_q.workspace_allocator + opt_q._0_8_
                                                      + (long)_space_ofs.
                                                                                                                            
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start[uVar15]);
                    }
                    lVar20 = lVar20 + __n;
                    Mat::~Mat((Mat *)&opt_q);
                  }
                  fVar29 = *(float *)((long)(this->weight_data_int8_scales).data + lVar23 * 4);
                  fVar28 = 0.0;
                  if (fVar29 != 0.0) {
                    fVar28 = 1.0 / (fVar29 * *(float *)((long)(this->bottom_blob_int8_scales).data +
                                                       lVar23 * 4));
                  }
                  fVar28 = (float)iVar17 * fVar28;
                  if (this->bias_term != 0) {
                    fVar28 = fVar28 + *(float *)((long)(this->bias_data).data + lVar24 * 4);
                  }
                  fVar29 = fVar28;
                  switch(this->activation_type) {
                  case 1:
                    if (fVar28 <= 0.0) {
                      fVar29 = 0.0;
                    }
                    break;
                  case 2:
                    fVar29 = (float)(~-(uint)(0.0 < fVar28) & *(this->activation_params).data |
                                    -(uint)(0.0 < fVar28) & 0x3f800000) * fVar28;
                    break;
                  case 3:
                    pfVar26 = (float *)(this->activation_params).data;
                    fVar29 = *pfVar26;
                    if (fVar28 <= fVar29) {
                      fVar28 = fVar29;
                    }
                    fVar2 = pfVar26[1];
                    fVar29 = fVar28;
                    if (fVar2 <= fVar28) {
                      fVar29 = fVar2;
                    }
                    break;
                  case 4:
                    fVar29 = expf(-fVar28);
                    fVar29 = 1.0 / (fVar29 + 1.0);
                    break;
                  case 5:
                    fVar29 = expf(fVar28);
                    fVar29 = logf(fVar29 + 1.0);
                    fVar29 = tanhf(fVar29);
                    fVar29 = fVar29 * fVar28;
                    break;
                  case 6:
                    pfVar26 = (float *)(this->activation_params).data;
                    fVar2 = *pfVar26;
                    fVar3 = pfVar26[1];
                    fVar30 = -fVar3 / fVar2;
                    fVar29 = 0.0;
                    if ((fVar30 <= fVar28) && (fVar29 = fVar28, fVar28 <= fVar30 + 1.0 / fVar2)) {
                      fVar29 = (fVar2 * fVar28 + fVar3) * fVar28;
                    }
                  }
                  if (iVar4 < 0x65) {
                    *local_1b8 = fVar29;
                    lStack_200 = 4;
                  }
                  else {
                    fVar29 = roundf(fVar29 * *(float *)((long)(this->top_blob_int8_scales).data +
                                                       lVar23 * 4));
                    iVar17 = (int)fVar29;
                    if (iVar17 < -0x7e) {
                      iVar17 = -0x7f;
                    }
                    uVar9 = (undefined1)iVar17;
                    if (0x7e < iVar17) {
                      uVar9 = 0x7f;
                    }
                    *(undefined1 *)local_1b8 = uVar9;
                    lStack_200 = 1;
                  }
                  local_1b8 = (float *)((long)local_1b8 + lStack_200);
                }
              }
            }
            iVar19 = this->group;
          }
        }
      }
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&_space_ofs.super__Vector_base<int,_std::allocator<int>_>);
    }
    Mat::~Mat(&bottom_blob_bordered);
    Mat::~Mat(&bottom_blob_int8);
  }
  return local_1c8;
}

Assistant:

int ConvolutionDepthWise::forward_int8(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    // convolv with NxN kernel
    // value = value + bias

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;

    if (channels % group != 0 || num_output % group != 0)
    {
        // reject invalid group
        return -100;
    }

    //     NCNN_LOGE("ConvolutionDepthWise input %d x %d  pad = %d %d  ksize=%d %d  stride=%d %d", w, h, pad_w, pad_h, kernel_w, kernel_h, stride_w, stride_h);

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    Mat bottom_blob_int8 = bottom_blob;
    if (elemsize != 1)
    {
        const int channels_g = channels / group;

        Mat scales(channels);
        {
            float* ps = scales;
            for (int g = 0; g < group; g++)
            {
                float scale = bottom_blob_int8_scales[g];
                for (int q = 0; q < channels_g; q++)
                {
                    *ps++ = scale;
                }
            }
        }

        Option opt_q = opt;
        opt_q.blob_allocator = opt.workspace_allocator;
        quantize_to_int8(bottom_blob, bottom_blob_int8, scales, opt_q);
    }

    Mat bottom_blob_bordered;
    make_padding(bottom_blob_int8, bottom_blob_bordered, opt);
    if (bottom_blob_bordered.empty())
        return -100;

    w = bottom_blob_bordered.w;
    h = bottom_blob_bordered.h;

    int outw = (w - kernel_extent_w) / stride_w + 1;
    int outh = (h - kernel_extent_h) / stride_h + 1;

    const int maxk = kernel_w * kernel_h;

    // kernel offsets
    std::vector<int> _space_ofs(maxk);
    int* space_ofs = &_space_ofs[0];
    {
        int p1 = 0;
        int p2 = 0;
        int gap = w * dilation_h - kernel_w * dilation_w;
        for (int i = 0; i < kernel_h; i++)
        {
            for (int j = 0; j < kernel_w; j++)
            {
                space_ofs[p1] = p2;
                p1++;
                p2 += dilation_w;
            }
            p2 += gap;
        }
    }

    // int8
    bool use_int8_requantize = int8_scale_term > 100;
    size_t out_elemsize = use_int8_requantize ? 1u : 4u;

    top_blob.create(outw, outh, num_output, out_elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    // depth-wise
    if (channels == group && group == num_output)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int g = 0; g < group; g++)
        {
            signed char* outptr = top_blob.channel(g);
            const signed char* kptr = (const signed char*)weight_data + maxk * g;
            const Mat m = bottom_blob_bordered.channel(g);

            for (int i = 0; i < outh; i++)
            {
                for (int j = 0; j < outw; j++)
                {
                    int sum = 0;

                    const signed char* sptr = m.row<signed char>(i * stride_h) + j * stride_w;

                    for (int k = 0; k < maxk; k++)
                    {
                        signed char val = sptr[space_ofs[k]];
                        signed char w = kptr[k];
                        sum += val * w;
                    }

                    float scale_in;
                    if (weight_data_int8_scales[g] == 0)
                        scale_in = 0;
                    else
                        scale_in = 1.f / (bottom_blob_int8_scales[g] * weight_data_int8_scales[g]);

                    float sumfp32 = sum * scale_in;

                    if (bias_term)
                        sumfp32 += bias_data[g];

                    sumfp32 = activation_ss(sumfp32, activation_type, activation_params);

                    if (use_int8_requantize)
                    {
                        // requantize
                        float scale_out = top_blob_int8_scales[g];
                        signed char sums8 = float2int8(sumfp32 * scale_out);
                        outptr[0] = sums8;
                        outptr += 1;
                    }
                    else
                    {
                        // dequantize
                        ((float*)outptr)[0] = sumfp32;
                        outptr += 4;
                    }
                }
            }
        }
    }
    else
    {
        // group convolution
        const int channels_g = channels / group;
        const int num_output_g = num_output / group;

#ifdef _WIN32
        #pragma omp parallel for num_threads(opt.num_threads)
#else // _WIN32
        #pragma omp parallel for collapse(2) num_threads(opt.num_threads)
#endif // _WIN32
        for (int g = 0; g < group; g++)
        {
            for (int p = 0; p < num_output_g; p++)
            {
                signed char* outptr = top_blob.channel(g * num_output_g + p);
                const signed char* weight_data_ptr = (const signed char*)weight_data + maxk * channels_g * num_output_g * g;

                for (int i = 0; i < outh; i++)
                {
                    for (int j = 0; j < outw; j++)
                    {
                        int sum = 0;

                        const signed char* kptr = weight_data_ptr + maxk * channels_g * p;

                        // channels_g
                        for (int q = 0; q < channels_g; q++)
                        {
                            const Mat m = bottom_blob_bordered.channel(channels_g * g + q);
                            const signed char* sptr = m.row<signed char>(i * stride_h) + j * stride_w;

                            for (int k = 0; k < maxk; k++)
                            {
                                signed char val = sptr[space_ofs[k]];
                                signed char w = kptr[k];
                                sum += val * w;
                            }

                            kptr += maxk;
                        }

                        float scale_in;
                        if (weight_data_int8_scales[g] == 0)
                            scale_in = 0;
                        else
                            scale_in = 1.f / (bottom_blob_int8_scales[g] * weight_data_int8_scales[g]);

                        float sumfp32 = sum * scale_in;

                        if (bias_term)
                            sumfp32 += bias_data[g * num_output_g + p];

                        sumfp32 = activation_ss(sumfp32, activation_type, activation_params);

                        if (use_int8_requantize)
                        {
                            // requantize
                            float scale_out = top_blob_int8_scales[g];
                            signed char sums8 = float2int8(sumfp32 * scale_out);
                            outptr[0] = sums8;
                            outptr += 1;
                        }
                        else
                        {
                            // dequantize
                            ((float*)outptr)[0] = sumfp32;
                            outptr += 4;
                        }
                    }
                }
            }
        }
    }

    return 0;
}